

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav__metadata_process_unknown_chunk
                    (ma_dr_wav__metadata_parser *pParser,ma_uint8 *pChunkId,ma_uint64 chunkSize,
                    ma_dr_wav_metadata_location location)

{
  ma_dr_wav_metadata *pmVar1;
  ma_uint64 mVar2;
  ma_uint8 *pmVar3;
  ma_bool32 mVar4;
  ma_uint64 mVar5;
  ma_uint64 *pmVar6;
  size_t extra;
  
  if (location == ma_dr_wav_metadata_location_invalid) {
    return 0;
  }
  mVar4 = ma_dr_wav_fourcc_equal(pChunkId,"data");
  if (((mVar4 == 0) && (mVar4 = ma_dr_wav_fourcc_equal(pChunkId,"fmt "), mVar4 == 0)) &&
     (mVar4 = ma_dr_wav_fourcc_equal(pChunkId,"fact"), mVar4 == 0)) {
    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
      pParser->metadataCount = pParser->metadataCount + 1;
      pmVar6 = &pParser->extraCapacity;
      mVar5 = 0;
    }
    else {
      pmVar1 = pParser->pMetadata;
      mVar2 = pParser->metadataCursor;
      pmVar1[mVar2].type = ma_dr_wav_metadata_type_unknown;
      pmVar1[mVar2].data.unknown.chunkLocation = location;
      pmVar1[mVar2].data.unknown.id[0] = *pChunkId;
      pmVar1[mVar2].data.inst.fineTuneCents = pChunkId[1];
      pmVar1[mVar2].data.inst.gainDecibels = pChunkId[2];
      pmVar1[mVar2].data.inst.lowNote = pChunkId[3];
      pmVar1[mVar2].data.smpl.samplePeriodNanoseconds = (ma_uint32)chunkSize;
      pmVar3 = pParser->pDataCursor;
      pParser->pDataCursor = pmVar3 + chunkSize;
      pmVar1[mVar2].data.bext.pOriginatorReference = (char *)pmVar3;
      mVar5 = (*pParser->onRead)(pParser->pReadSeekUserData,pmVar3,
                                 (size_t)pmVar1[mVar2].data.smpl.samplePeriodNanoseconds);
      if (mVar5 != pmVar1[mVar2].data.smpl.samplePeriodNanoseconds) {
        return mVar5;
      }
      pmVar6 = &pParser->metadataCursor;
      chunkSize = 1;
    }
    *pmVar6 = *pmVar6 + chunkSize;
    return mVar5;
  }
  return 0;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__metadata_process_unknown_chunk(ma_dr_wav__metadata_parser* pParser, const ma_uint8* pChunkId, ma_uint64 chunkSize, ma_dr_wav_metadata_location location)
{
    ma_uint64 bytesRead = 0;
    if (location == ma_dr_wav_metadata_location_invalid) {
        return 0;
    }
    if (ma_dr_wav_fourcc_equal(pChunkId, "data") || ma_dr_wav_fourcc_equal(pChunkId, "fmt ") || ma_dr_wav_fourcc_equal(pChunkId, "fact")) {
        return 0;
    }
    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
        pParser->metadataCount += 1;
        ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, (size_t)chunkSize, 1);
    } else {
        ma_dr_wav_metadata* pMetadata = &pParser->pMetadata[pParser->metadataCursor];
        pMetadata->type                         = ma_dr_wav_metadata_type_unknown;
        pMetadata->data.unknown.chunkLocation   = location;
        pMetadata->data.unknown.id[0]           = pChunkId[0];
        pMetadata->data.unknown.id[1]           = pChunkId[1];
        pMetadata->data.unknown.id[2]           = pChunkId[2];
        pMetadata->data.unknown.id[3]           = pChunkId[3];
        pMetadata->data.unknown.dataSizeInBytes = (ma_uint32)chunkSize;
        pMetadata->data.unknown.pData           = (ma_uint8 *)ma_dr_wav__metadata_get_memory(pParser, (size_t)chunkSize, 1);
        MA_DR_WAV_ASSERT(pMetadata->data.unknown.pData != NULL);
        bytesRead = ma_dr_wav__metadata_parser_read(pParser, pMetadata->data.unknown.pData, pMetadata->data.unknown.dataSizeInBytes, NULL);
        if (bytesRead == pMetadata->data.unknown.dataSizeInBytes) {
            pParser->metadataCursor += 1;
        } else {
        }
    }
    return bytesRead;
}